

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::concat<kj::CappedArray<char,24ul>,kj::StringPtr&,kj::CappedArray<char,32ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_24UL> *params,
          StringPtr *params_1,CappedArray<char,_32UL> *params_2)

{
  size_t size;
  char *target;
  CappedArray<char,_24UL> *first;
  StringPtr *rest;
  CappedArray<char,_32UL> *rest_1;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  _ *local_40;
  undefined8 local_38;
  undefined1 local_29;
  CappedArray<char,_32UL> *local_28;
  CappedArray<char,_32UL> *params_local_2;
  StringPtr *params_local_1;
  CappedArray<char,_24UL> *params_local;
  String *result;
  
  local_29 = 0;
  local_28 = (CappedArray<char,_32UL> *)params_1;
  params_local_2 = (CappedArray<char,_32UL> *)params;
  params_local_1 = (StringPtr *)this;
  params_local = (CappedArray<char,_24UL> *)__return_storage_ptr__;
  local_58 = CappedArray<char,_24UL>::size((CappedArray<char,_24UL> *)this);
  local_50 = StringPtr::size((StringPtr *)params_local_2);
  local_48 = CappedArray<char,_32UL>::size(local_28);
  local_40 = (_ *)&local_58;
  local_38 = 3;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x3;
  size = sum(local_40,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::CappedArray<char,24ul>>((NoInfer<kj::CappedArray<char,_24UL>_> *)params_local_1);
  rest = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  rest_1 = fwd<kj::CappedArray<char,32ul>>(local_28);
  fill<kj::CappedArray<char,24ul>,kj::StringPtr&,kj::CappedArray<char,32ul>>
            (target,first,rest,rest_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}